

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

_Bool duckdb_je_tcaches_create(tsd_t *tsd,base_t *base,uint *r_ind)

{
  int iVar1;
  byte bVar2;
  byte local_29;
  
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)((long)&tcaches_mtx.field_0 + 0x48));
  if (iVar1 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&tcaches_mtx);
    tcaches_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  tcaches_mtx.field_0.field_0.prof_data.n_lock_ops =
       tcaches_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(tcaches_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    tcaches_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(tcaches_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    tcaches_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  if (duckdb_je_tcaches == (tcaches_t *)0x0) {
    duckdb_je_tcaches = (tcaches_t *)duckdb_je_base_alloc((tsdn_t *)tsd,base,0x7ff0,0x40);
    if (duckdb_je_tcaches == (tcaches_t *)0x0) {
      bVar2 = 1;
      goto LAB_011a62ed;
    }
  }
  if ((tcaches_avail != (tcaches_t *)0x0) || (bVar2 = 1, tcaches_past < 0xffe)) {
    duckdb_je_tcaches_create_cold_1();
    bVar2 = local_29;
  }
LAB_011a62ed:
  tcaches_mtx.field_0.field_0.locked.repr = (atomic_b_t)false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&tcaches_mtx.field_0 + 0x48));
  return (_Bool)(bVar2 & 1);
}

Assistant:

bool
tcaches_create(tsd_t *tsd, base_t *base, unsigned *r_ind) {
	witness_assert_depth(tsdn_witness_tsdp_get(tsd_tsdn(tsd)), 0);

	bool err;

	malloc_mutex_lock(tsd_tsdn(tsd), &tcaches_mtx);

	if (tcaches_create_prep(tsd, base)) {
		err = true;
		goto label_return;
	}

	tcache_t *tcache = tcache_create_explicit(tsd);
	if (tcache == NULL) {
		err = true;
		goto label_return;
	}

	tcaches_t *elm;
	if (tcaches_avail != NULL) {
		elm = tcaches_avail;
		tcaches_avail = tcaches_avail->next;
		elm->tcache = tcache;
		*r_ind = (unsigned)(elm - tcaches);
	} else {
		elm = &tcaches[tcaches_past];
		elm->tcache = tcache;
		*r_ind = tcaches_past;
		tcaches_past++;
	}

	err = false;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &tcaches_mtx);
	witness_assert_depth(tsdn_witness_tsdp_get(tsd_tsdn(tsd)), 0);
	return err;
}